

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool tinyusdz::ExtractVariants(Layer *layer,Dictionary *dict,string *err)

{
  bool bVar1;
  string *in_R9;
  __node_base *p_Var2;
  bool bVar3;
  string local_50;
  
  if (dict == (Dictionary *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar3 = false;
  }
  else {
    p_Var2 = &(layer->_prim_specs)._M_h._M_before_begin;
    do {
      p_Var2 = p_Var2->_M_nxt;
      bVar3 = p_Var2 == (__node_base *)0x0;
      if (bVar3) {
        return bVar3;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      bVar1 = anon_unknown_160::ExtractVariantsRec
                        (0,&local_50,(PrimSpec *)(p_Var2 + 5),dict,(uint32_t)err,in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (bVar1);
  }
  return bVar3;
}

Assistant:

bool ExtractVariants(const Layer &layer, Dictionary *dict, std::string *err) {
  if (!dict) {
    if (err) {
      (*err) += "`dict` argument is nullptr.\n";
    }

    return false;
  }

  for (const auto &primspec : layer.primspecs()) {
    if (!ExtractVariantsRec(/* depth */ 0, /* root path */ "", primspec.second,
                            (*dict), /* max_depth */ 1024 * 1024, err)) {
      return false;
    }
  }

  return true;
}